

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::WriteXMLGlobal(cmCTestSVN *this,cmXMLWriter *xml)

{
  allocator<char> local_39;
  string local_38;
  
  cmCTestGlobalVC::WriteXMLGlobal(&this->super_cmCTestGlobalVC,xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SVNPath",&local_39);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_38,&this->RootInfo->Base);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCTestSVN::WriteXMLGlobal(cmXMLWriter& xml)
{
  this->cmCTestGlobalVC::WriteXMLGlobal(xml);

  xml.Element("SVNPath", this->RootInfo->Base);
}